

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

string * cmExtraEclipseCDT4Generator::GetEclipsePath(string *__return_storage_ptr__,string *path)

{
  string *path_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraEclipseCDT4Generator::GetEclipsePath(
  const std::string& path)
{
#if defined(__CYGWIN__)
  std::string cmd = "cygpath -m " + path;
  std::string out;
  if (!cmSystemTools::RunSingleCommand(cmd.c_str(), &out, &out)) {
    return path;
  } else {
    out.erase(out.find_last_of('\n'));
    return out;
  }
#else
  return path;
#endif
}